

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool> *
__thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::insert
          (pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
           *__return_storage_ptr__,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,ValueT *val)

{
  bool bVar1;
  reference pvVar2;
  iterator endBucket;
  pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
  *result;
  __normal_iterator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_*,_std::vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_68;
  BucketIterator local_60;
  ValueIterator local_58;
  hashtable_iterator local_50;
  pair<int,_int> *local_38;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_30;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  ValueIterator it;
  size_t bucketIdx;
  ValueT *val_local;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this_local;
  
  std::
  pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>::
  pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool,_true>
            (__return_storage_ptr__);
  it._M_current = (pair<int,_int> *)hash_to_bucket(this,&val->first);
  pvVar2 = std::
           vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ::operator[](&this->mBuckets,(size_type)it._M_current);
  local_28._M_current = (pair<int,_int> *)find_in_bucket(this,pvVar2,&val->first);
  __return_storage_ptr__->second = false;
  pvVar2 = std::
           vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ::operator[](&this->mBuckets,(size_type)it._M_current);
  local_30._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(pvVar2);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_30);
  if (bVar1) {
    local_38 = (pair<int,_int> *)insert_to_bucket(this,val,(size_t *)&it);
    __return_storage_ptr__->second = true;
    local_28._M_current = local_38;
  }
  local_58._M_current = local_28._M_current;
  local_68._M_current =
       (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
       std::
       vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
       ::begin(&this->mBuckets);
  local_60._M_current =
       (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
       __gnu_cxx::
       __normal_iterator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_*,_std::vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
       ::operator+(&local_68,(difference_type)it._M_current);
  endBucket = std::
              vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              ::end(&this->mBuckets);
  hashtable_iterator::hashtable_iterator
            (&local_50,local_58,local_60,(BucketIterator)endBucket._M_current);
  (__return_storage_ptr__->first).mCurValueItr._M_current = local_50.mCurValueItr._M_current;
  (__return_storage_ptr__->first).mCurBucketItr._M_current = local_50.mCurBucketItr._M_current;
  (__return_storage_ptr__->first).mEndBucketItr._M_current = local_50.mEndBucketItr._M_current;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator,bool> insert(const ValueT& val) {
      std::pair<iterator,bool> result;
      size_t bucketIdx = hash_to_bucket(val.first);
      ValueIterator it = find_in_bucket(mBuckets[bucketIdx], val.first);
      result.second = false;
      if (it == mBuckets[bucketIdx].end()) {
        it = insert_to_bucket(val, bucketIdx );
        result.second = true;
      }
      result.first = iterator(it,
                              mBuckets.begin()+bucketIdx,
                              mBuckets.end());
      return result;
    }